

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionals.cc
# Opt level: O2

PassDef * verona::conditionals(void)

{
  long lVar1;
  PassDef *in_RDI;
  allocator<char> local_2809;
  Token local_2808;
  Token local_2800;
  Token local_27f8;
  Token local_27f0;
  Token local_27e8;
  Token local_27e0;
  Token local_27d8;
  Token local_27d0;
  Token local_27c8;
  Token local_27c0;
  Token local_27b8;
  Token local_27b0;
  Token local_27a8;
  Token local_27a0;
  Token local_2798;
  Token local_2790;
  Token local_2788;
  Token local_2780;
  Token local_2778;
  Token local_2770;
  Token local_2768;
  Token local_2760;
  Token local_2758;
  Token local_2750;
  Token local_2748;
  Token local_2740;
  Token local_2738;
  Token local_2730;
  Token local_2728;
  Token local_2720;
  Token local_2718;
  Token local_2710;
  Token local_2708;
  string local_2700;
  initializer_list<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>
  local_26e0;
  pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
  local_26d0;
  Located<trieste::detail::Pattern> local_2630;
  undefined8 local_25b0;
  undefined8 uStack_25a8;
  code *local_25a0;
  code *local_2598;
  Located<trieste::detail::Pattern> local_2590;
  undefined8 local_2510;
  undefined8 uStack_2508;
  code *local_2500;
  code *local_24f8;
  Located<trieste::detail::Pattern> local_24f0;
  undefined8 local_2470;
  undefined8 uStack_2468;
  code *local_2460;
  code *local_2458;
  Located<trieste::detail::Pattern> local_2450;
  undefined8 local_23d0;
  undefined8 uStack_23c8;
  code *local_23c0;
  code *local_23b8;
  Located<trieste::detail::Pattern> local_23b0;
  undefined8 local_2330;
  undefined8 uStack_2328;
  code *local_2320;
  code *local_2318;
  Pattern local_2310;
  Pattern local_2298;
  Pattern local_2220;
  Pattern local_21a8;
  Pattern local_2130;
  Pattern local_20b8;
  Pattern local_2040;
  Pattern local_1fc8;
  Pattern local_1f50;
  Pattern local_1ed8;
  Pattern local_1e60;
  Pattern local_1de8;
  Pattern local_1d70;
  Pattern local_1cf8;
  Pattern local_1c80;
  Pattern local_1c08;
  Pattern local_1b90;
  Pattern local_1b18;
  Pattern local_1aa0;
  Pattern local_1a28;
  Pattern local_19b0;
  Pattern local_1938;
  Pattern local_18c0;
  Pattern local_1848;
  Pattern local_17d0;
  Pattern local_1758;
  Pattern local_16e0;
  Pattern local_1668;
  Pattern local_15f0;
  Pattern local_1578;
  Pattern local_1500;
  Pattern local_1488;
  Pattern local_1410;
  Pattern local_1398;
  Pattern local_1320;
  Pattern local_12a8;
  Pattern local_1230;
  Pattern local_11b8;
  Pattern local_1140;
  Pattern local_10c8;
  Pattern local_1050;
  Pattern local_fd8;
  Pattern local_f60;
  Pattern local_ee8;
  Pattern local_e70;
  Pattern local_df8;
  Pattern local_d80;
  Pattern local_d08;
  Pattern local_c90;
  Pattern local_c18;
  Pattern local_ba0;
  Pattern local_b28;
  Pattern local_ab0;
  Pattern local_a38;
  Pattern local_9c0;
  Pattern local_948;
  Pattern local_8d0;
  Pattern local_858;
  Pattern local_7e0;
  Pattern local_768;
  Pattern local_6f0;
  Pattern local_678;
  Pattern local_600;
  Pattern local_588;
  Pattern local_510;
  Pattern local_498;
  Pattern local_420;
  Pattern local_3a8;
  Located<trieste::detail::Pattern> local_330;
  Located<trieste::detail::Pattern> local_2b0;
  Located<trieste::detail::Pattern> local_230;
  Located<trieste::detail::Pattern> local_1b0;
  Located<trieste::detail::Pattern> local_130;
  Located<trieste::detail::Pattern> local_b0;
  
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2700,"conditionals",&local_2809);
  local_2708.def = (TokenDef *)Expr;
  trieste::In<>(&local_588,&local_2708);
  local_2710.def = (TokenDef *)If;
  trieste::T(&local_600,&local_2710);
  trieste::detail::Pattern::operator*(&local_510,&local_588,&local_600);
  local_2718.def = (TokenDef *)Lambda;
  trieste::T(&local_7e0,&local_2718);
  trieste::detail::Pattern::operator!(&local_768,&local_7e0);
  local_2720.def = (TokenDef *)Lambda;
  trieste::T(&local_948,&local_2720);
  trieste::detail::Pattern::operator!(&local_8d0,&local_948);
  trieste::detail::Pattern::operator++(&local_858,&local_8d0,0);
  trieste::detail::Pattern::operator*(&local_6f0,&local_768,&local_858);
  local_2728.def = (TokenDef *)Expr;
  trieste::detail::Pattern::operator[](&local_678,&local_6f0,&local_2728);
  trieste::detail::Pattern::operator*(&local_498,&local_510,&local_678);
  local_2730.def = (TokenDef *)Lambda;
  trieste::T(&local_a38,&local_2730);
  local_2738.def = (TokenDef *)Lhs;
  trieste::detail::Pattern::operator[](&local_9c0,&local_a38,&local_2738);
  trieste::detail::Pattern::operator*(&local_420,&local_498,&local_9c0);
  local_2740.def = (TokenDef *)Else;
  trieste::T(&local_d80,&local_2740);
  local_2748.def = (TokenDef *)If;
  trieste::T(&local_df8,&local_2748);
  trieste::detail::Pattern::operator*(&local_d08,&local_d80,&local_df8);
  local_2750.def = (TokenDef *)Lambda;
  trieste::T(&local_f60,&local_2750);
  trieste::detail::Pattern::operator!(&local_ee8,&local_f60);
  local_2758.def = (TokenDef *)Lambda;
  trieste::T(&local_10c8,&local_2758);
  trieste::detail::Pattern::operator!(&local_1050,&local_10c8);
  trieste::detail::Pattern::operator++(&local_fd8,&local_1050,0);
  trieste::detail::Pattern::operator*(&local_e70,&local_ee8,&local_fd8);
  trieste::detail::Pattern::operator*(&local_c90,&local_d08,&local_e70);
  local_2760.def = (TokenDef *)Lambda;
  trieste::T(&local_1140,&local_2760);
  trieste::detail::Pattern::operator*(&local_c18,&local_c90,&local_1140);
  trieste::detail::Pattern::operator++(&local_ba0,&local_c18,0);
  local_2768.def = (TokenDef *)Else;
  trieste::T(&local_12a8,&local_2768);
  local_2770.def = (TokenDef *)Lambda;
  trieste::T(&local_1320,&local_2770);
  trieste::detail::Pattern::operator*(&local_1230,&local_12a8,&local_1320);
  trieste::detail::Pattern::operator~(&local_11b8,&local_1230);
  trieste::detail::Pattern::operator*(&local_b28,&local_ba0,&local_11b8);
  local_2778.def = (TokenDef *)Rhs;
  trieste::detail::Pattern::operator[](&local_ab0,&local_b28,&local_2778);
  trieste::detail::Pattern::operator*(&local_3a8,&local_420,&local_ab0);
  trieste::detail::Pattern::Pattern(&local_b0.value,&local_3a8);
  local_b0.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_0026ef88;
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_26d0.first,&local_b0);
  local_26d0.second.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_26d0.second.super__Function_base._M_functor._8_8_ = 0;
  local_26d0.second._M_invoker =
       ::std::
       _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/conditionals.cc:89:11)>
       ::_M_invoke;
  local_26d0.second.super__Function_base._M_manager =
       ::std::
       _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/conditionals.cc:89:11)>
       ::_M_manager;
  local_2780.def = (TokenDef *)Conditional;
  trieste::T(&local_1410,&local_2780);
  local_2788.def = (TokenDef *)Else;
  trieste::T(&local_1668,&local_2788);
  local_2790.def = (TokenDef *)If;
  trieste::T(&local_16e0,&local_2790);
  trieste::detail::Pattern::operator*(&local_15f0,&local_1668,&local_16e0);
  local_2798.def = (TokenDef *)Lambda;
  trieste::T(&local_18c0,&local_2798);
  trieste::detail::Pattern::operator!(&local_1848,&local_18c0);
  local_27a0.def = (TokenDef *)Lambda;
  trieste::T(&local_1a28,&local_27a0);
  trieste::detail::Pattern::operator!(&local_19b0,&local_1a28);
  trieste::detail::Pattern::operator++(&local_1938,&local_19b0,0);
  trieste::detail::Pattern::operator*(&local_17d0,&local_1848,&local_1938);
  local_27a8.def = (TokenDef *)Expr;
  trieste::detail::Pattern::operator[](&local_1758,&local_17d0,&local_27a8);
  trieste::detail::Pattern::operator*(&local_1578,&local_15f0,&local_1758);
  local_27b0.def = (TokenDef *)Lambda;
  trieste::T(&local_1b18,&local_27b0);
  local_27b8.def = (TokenDef *)Lhs;
  trieste::detail::Pattern::operator[](&local_1aa0,&local_1b18,&local_27b8);
  trieste::detail::Pattern::operator*(&local_1500,&local_1578,&local_1aa0);
  trieste::detail::Pattern::operator++(&local_1c08,(Pattern *)trieste::Any,0);
  local_27c0.def = (TokenDef *)Rhs;
  trieste::detail::Pattern::operator[](&local_1b90,&local_1c08,&local_27c0);
  trieste::detail::Pattern::operator*(&local_1488,&local_1500,&local_1b90);
  trieste::detail::Pattern::operator<<(&local_1398,&local_1410,&local_1488);
  trieste::detail::Pattern::Pattern(&local_130.value,&local_1398);
  local_130.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_0026efa0;
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_2630,&local_130);
  local_25b0 = 0;
  uStack_25a8 = 0;
  local_2598 = ::std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/conditionals.cc:95:11)>
               ::_M_invoke;
  local_25a0 = ::std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/conditionals.cc:95:11)>
               ::_M_manager;
  local_27c8.def = (TokenDef *)Conditional;
  trieste::T(&local_1cf8,&local_27c8);
  local_27d0.def = (TokenDef *)Else;
  trieste::T(&local_1e60,&local_27d0);
  local_27d8.def = (TokenDef *)Lambda;
  trieste::T(&local_1f50,&local_27d8);
  local_27e0.def = (TokenDef *)Rhs;
  trieste::detail::Pattern::operator[](&local_1ed8,&local_1f50,&local_27e0);
  trieste::detail::Pattern::operator*(&local_1de8,&local_1e60,&local_1ed8);
  trieste::detail::Pattern::Pattern(&local_1fc8,(Pattern *)trieste::End);
  trieste::detail::Pattern::operator*(&local_1d70,&local_1de8,&local_1fc8);
  trieste::detail::Pattern::operator<<(&local_1c80,&local_1cf8,&local_1d70);
  trieste::detail::Pattern::Pattern(&local_1b0.value,&local_1c80);
  local_1b0.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_0026efb8;
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_2590,&local_1b0);
  local_2510 = 0;
  uStack_2508 = 0;
  local_24f8 = ::std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/conditionals.cc:98:11)>
               ::_M_invoke;
  local_2500 = ::std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/conditionals.cc:98:11)>
               ::_M_manager;
  local_27e8.def = (TokenDef *)Conditional;
  trieste::T(&local_20b8,&local_27e8);
  trieste::detail::Pattern::Pattern(&local_2130,(Pattern *)trieste::End);
  trieste::detail::Pattern::operator<<(&local_2040,&local_20b8,&local_2130);
  trieste::detail::Pattern::Pattern(&local_230.value,&local_2040);
  local_230.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_0026efd0;
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_24f0,&local_230);
  local_2470 = 0;
  uStack_2468 = 0;
  local_2458 = ::std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/conditionals.cc:100:35)>
               ::_M_invoke;
  local_2460 = ::std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/conditionals.cc:100:35)>
               ::_M_manager;
  local_27f0.def = (TokenDef *)If;
  trieste::T(&local_2220,&local_27f0);
  local_27f8.def = (TokenDef *)If;
  trieste::detail::Pattern::operator[](&local_21a8,&local_2220,&local_27f8);
  trieste::detail::Pattern::Pattern(&local_2b0.value,&local_21a8);
  local_2b0.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_0026efe8;
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_2450,&local_2b0);
  local_23d0 = 0;
  uStack_23c8 = 0;
  local_23b8 = ::std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/conditionals.cc:103:11)>
               ::_M_invoke;
  local_23c0 = ::std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/conditionals.cc:103:11)>
               ::_M_manager;
  local_2800.def = (TokenDef *)Else;
  trieste::T(&local_2310,&local_2800);
  local_2808.def = (TokenDef *)Else;
  trieste::detail::Pattern::operator[](&local_2298,&local_2310,&local_2808);
  trieste::detail::Pattern::Pattern(&local_330.value,&local_2298);
  local_330.location.location._M_impl =
       (source_location)&PTR_s__workspace_llm4binary_github_lic_0026f000;
  trieste::detail::Located<trieste::detail::Pattern>::Located(&local_23b0,&local_330);
  local_26e0._M_array = &local_26d0;
  local_2330 = 0;
  uStack_2328 = 0;
  local_2318 = ::std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/conditionals.cc:109:11)>
               ::_M_invoke;
  local_2320 = ::std::
               _Function_handler<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/passes/conditionals.cc:109:11)>
               ::_M_manager;
  local_26e0._M_len = 6;
  trieste::PassDef::PassDef(in_RDI,&local_2700,(Wellformed *)wfPassConditionals,2,&local_26e0);
  lVar1 = 800;
  do {
    ::std::
    pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
    ::~pair((pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
             *)((long)&local_26d0.first.value.pattern.
                       super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar1));
    lVar1 = lVar1 + -0xa0;
  } while (lVar1 != -0xa0);
  trieste::detail::Pattern::~Pattern(&local_330.value);
  trieste::detail::Pattern::~Pattern(&local_2298);
  trieste::detail::Pattern::~Pattern(&local_2310);
  trieste::detail::Pattern::~Pattern(&local_2b0.value);
  trieste::detail::Pattern::~Pattern(&local_21a8);
  trieste::detail::Pattern::~Pattern(&local_2220);
  trieste::detail::Pattern::~Pattern(&local_230.value);
  trieste::detail::Pattern::~Pattern(&local_2040);
  trieste::detail::Pattern::~Pattern(&local_2130);
  trieste::detail::Pattern::~Pattern(&local_20b8);
  trieste::detail::Pattern::~Pattern(&local_1b0.value);
  trieste::detail::Pattern::~Pattern(&local_1c80);
  trieste::detail::Pattern::~Pattern(&local_1d70);
  trieste::detail::Pattern::~Pattern(&local_1fc8);
  trieste::detail::Pattern::~Pattern(&local_1de8);
  trieste::detail::Pattern::~Pattern(&local_1ed8);
  trieste::detail::Pattern::~Pattern(&local_1f50);
  trieste::detail::Pattern::~Pattern(&local_1e60);
  trieste::detail::Pattern::~Pattern(&local_1cf8);
  trieste::detail::Pattern::~Pattern(&local_130.value);
  trieste::detail::Pattern::~Pattern(&local_1398);
  trieste::detail::Pattern::~Pattern(&local_1488);
  trieste::detail::Pattern::~Pattern(&local_1b90);
  trieste::detail::Pattern::~Pattern(&local_1c08);
  trieste::detail::Pattern::~Pattern(&local_1500);
  trieste::detail::Pattern::~Pattern(&local_1aa0);
  trieste::detail::Pattern::~Pattern(&local_1b18);
  trieste::detail::Pattern::~Pattern(&local_1578);
  trieste::detail::Pattern::~Pattern(&local_1758);
  trieste::detail::Pattern::~Pattern(&local_17d0);
  trieste::detail::Pattern::~Pattern(&local_1938);
  trieste::detail::Pattern::~Pattern(&local_19b0);
  trieste::detail::Pattern::~Pattern(&local_1a28);
  trieste::detail::Pattern::~Pattern(&local_1848);
  trieste::detail::Pattern::~Pattern(&local_18c0);
  trieste::detail::Pattern::~Pattern(&local_15f0);
  trieste::detail::Pattern::~Pattern(&local_16e0);
  trieste::detail::Pattern::~Pattern(&local_1668);
  trieste::detail::Pattern::~Pattern(&local_1410);
  trieste::detail::Pattern::~Pattern(&local_b0.value);
  trieste::detail::Pattern::~Pattern(&local_3a8);
  trieste::detail::Pattern::~Pattern(&local_ab0);
  trieste::detail::Pattern::~Pattern(&local_b28);
  trieste::detail::Pattern::~Pattern(&local_11b8);
  trieste::detail::Pattern::~Pattern(&local_1230);
  trieste::detail::Pattern::~Pattern(&local_1320);
  trieste::detail::Pattern::~Pattern(&local_12a8);
  trieste::detail::Pattern::~Pattern(&local_ba0);
  trieste::detail::Pattern::~Pattern(&local_c18);
  trieste::detail::Pattern::~Pattern(&local_1140);
  trieste::detail::Pattern::~Pattern(&local_c90);
  trieste::detail::Pattern::~Pattern(&local_e70);
  trieste::detail::Pattern::~Pattern(&local_fd8);
  trieste::detail::Pattern::~Pattern(&local_1050);
  trieste::detail::Pattern::~Pattern(&local_10c8);
  trieste::detail::Pattern::~Pattern(&local_ee8);
  trieste::detail::Pattern::~Pattern(&local_f60);
  trieste::detail::Pattern::~Pattern(&local_d08);
  trieste::detail::Pattern::~Pattern(&local_df8);
  trieste::detail::Pattern::~Pattern(&local_d80);
  trieste::detail::Pattern::~Pattern(&local_420);
  trieste::detail::Pattern::~Pattern(&local_9c0);
  trieste::detail::Pattern::~Pattern(&local_a38);
  trieste::detail::Pattern::~Pattern(&local_498);
  trieste::detail::Pattern::~Pattern(&local_678);
  trieste::detail::Pattern::~Pattern(&local_6f0);
  trieste::detail::Pattern::~Pattern(&local_858);
  trieste::detail::Pattern::~Pattern(&local_8d0);
  trieste::detail::Pattern::~Pattern(&local_948);
  trieste::detail::Pattern::~Pattern(&local_768);
  trieste::detail::Pattern::~Pattern(&local_7e0);
  trieste::detail::Pattern::~Pattern(&local_510);
  trieste::detail::Pattern::~Pattern(&local_600);
  trieste::detail::Pattern::~Pattern(&local_588);
  ::std::__cxx11::string::~string((string *)&local_2700);
  return in_RDI;
}

Assistant:

PassDef conditionals()
  {
    return {
      "conditionals",
      wfPassConditionals,
      dir::topdown,
      {
        // Conditionals are right-associative.
        In(Expr) * T(If) * (!T(Lambda) * (!T(Lambda))++)[Expr] *
            T(Lambda)[Lhs] *
            ((T(Else) * T(If) * (!T(Lambda) * (!T(Lambda))++) * T(Lambda))++ *
             ~(T(Else) * T(Lambda)))[Rhs] >>
          [](Match& _) { return make_conditional(_); },

        T(Conditional)
            << ((T(Else) * T(If) * (!T(Lambda) * (!T(Lambda))++)[Expr] *
                 T(Lambda)[Lhs]) *
                Any++[Rhs]) >>
          [](Match& _) { return make_conditional(_); },

        T(Conditional) << (T(Else) * T(Lambda)[Rhs] * End) >>
          [](Match& _) { return Seq << _(Rhs) << Unit; },

        T(Conditional) << End >> ([](Match&) -> Node { return Unit; }),

        T(If)[If] >>
          [](Match& _) {
            return err(
              _(If), "`if` must be followed by a condition and braces");
          },

        T(Else)[Else] >>
          [](Match& _) {
            return err(
              _(Else),
              "`else` must follow an `if` and be followed by an `if` or "
              "braces");
          },
      }};
  }